

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlmodelserialiser.cpp
# Opt level: O1

bool __thiscall
HtmlModelSerialiserPrivate::writeHtml(HtmlModelSerialiserPrivate *this,QXmlStreamWriter *writer)

{
  byte bVar1;
  QString modelName;
  QArrayData *local_48;
  char16_t *local_40;
  QAbstractItemModel *pQStack_38;
  QArrayData *local_30;
  char16_t *local_28;
  QAbstractItemModel *local_20;
  
  if ((this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
      m_constModel == (QAbstractItemModel *)0x0) {
    bVar1 = 0;
  }
  else {
    if (this->m_printStartDocument == true) {
      local_48 = (QArrayData *)0x0;
      local_40 = L"<!DOCTYPE html>";
      pQStack_38 = (QAbstractItemModel *)0xf;
      QXmlStreamWriter::writeDTD((QString *)writer);
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,2,8);
        }
      }
      local_48 = (QArrayData *)0x0;
      local_40 = L"html";
      pQStack_38 = (QAbstractItemModel *)0x4;
      QXmlStreamWriter::writeStartElement((QString *)writer);
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,2,8);
        }
      }
      local_48 = (QArrayData *)0x0;
      local_40 = L"head";
      pQStack_38 = (QAbstractItemModel *)0x4;
      QXmlStreamWriter::writeStartElement((QString *)writer);
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,2,8);
        }
      }
      local_48 = (QArrayData *)0x0;
      local_40 = L"meta";
      pQStack_38 = (QAbstractItemModel *)0x4;
      QXmlStreamWriter::writeEmptyElement((QString *)writer);
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,2,8);
        }
      }
      local_48 = (QArrayData *)0x0;
      local_40 = L"charset";
      pQStack_38 = (QAbstractItemModel *)0x7;
      local_30 = (QArrayData *)0x0;
      local_28 = L"UTF-8";
      local_20 = (QAbstractItemModel *)0x5;
      QXmlStreamWriter::writeAttribute((QString *)writer,(QString *)&local_48);
      if (local_30 != (QArrayData *)0x0) {
        LOCK();
        (local_30->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_30,2,8);
        }
      }
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,2,8);
        }
      }
      local_48 = (QArrayData *)0x0;
      local_40 = L"title";
      pQStack_38 = (QAbstractItemModel *)0x5;
      QXmlStreamWriter::writeStartElement((QString *)writer);
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,2,8);
        }
      }
      QObject::objectName();
      if (pQStack_38 == (QAbstractItemModel *)0x0) {
        local_30 = (QArrayData *)0x0;
        local_28 = L"Model";
        local_20 = (QAbstractItemModel *)0x5;
      }
      else {
        local_30 = local_48;
        local_28 = local_40;
        local_20 = pQStack_38;
        if (local_48 != (QArrayData *)0x0) {
          LOCK();
          (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      QXmlStreamWriter::writeCharacters((QString *)writer);
      if (local_30 != (QArrayData *)0x0) {
        LOCK();
        (local_30->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_30,2,8);
        }
      }
      QXmlStreamWriter::writeEndElement();
      local_30 = (QArrayData *)0x0;
      local_28 = L"style";
      local_20 = (QAbstractItemModel *)0x5;
      QXmlStreamWriter::writeStartElement((QString *)writer);
      if (local_30 != (QArrayData *)0x0) {
        LOCK();
        (local_30->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_30,2,8);
        }
      }
      local_30 = (QArrayData *)0x0;
      local_28 = 
      L"table, th, td { border: 1px solid black; } table { border-collapse: collapse; width: 100%; }"
      ;
      local_20 = (QAbstractItemModel *)0x5c;
      QXmlStreamWriter::writeCharacters((QString *)writer);
      if (local_30 != (QArrayData *)0x0) {
        LOCK();
        (local_30->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_30,2,8);
        }
      }
      QXmlStreamWriter::writeEndElement();
      QXmlStreamWriter::writeEndElement();
      local_30 = (QArrayData *)0x0;
      local_28 = L"body";
      local_20 = (QAbstractItemModel *)0x4;
      QXmlStreamWriter::writeStartElement((QString *)writer);
      if (local_30 != (QArrayData *)0x0) {
        LOCK();
        (local_30->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_30,2,8);
        }
      }
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,2,8);
        }
      }
    }
    local_48 = (QArrayData *)0x0;
    local_40 = L"div";
    pQStack_38 = (QAbstractItemModel *)0x3;
    QXmlStreamWriter::writeStartElement((QString *)writer);
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,8);
      }
    }
    local_48 = (QArrayData *)0x0;
    local_40 = L"data-modelcode";
    pQStack_38 = (QAbstractItemModel *)0xe;
    local_30 = (QArrayData *)0x0;
    local_28 = L"808FC674-78A0-4682-9C17-E05B18A0CDD3";
    local_20 = (QAbstractItemModel *)0x24;
    QXmlStreamWriter::writeAttribute((QString *)writer,(QString *)&local_48);
    if (local_30 != (QArrayData *)0x0) {
      LOCK();
      (local_30->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_30,2,8);
      }
    }
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,8);
      }
    }
    local_48 = (QArrayData *)0xffffffffffffffff;
    local_40 = (char16_t *)0x0;
    pQStack_38 = (QAbstractItemModel *)0x0;
    writeHtmlElement(this,writer,(QModelIndex *)&local_48);
    QXmlStreamWriter::writeEndElement();
    if (this->m_printStartDocument == true) {
      QXmlStreamWriter::writeEndElement();
      QXmlStreamWriter::writeEndElement();
    }
    bVar1 = QXmlStreamWriter::hasError();
    bVar1 = bVar1 ^ 1;
  }
  return (bool)bVar1;
}

Assistant:

bool HtmlModelSerialiserPrivate::writeHtml(QXmlStreamWriter &writer) const
{
    if (!m_constModel)
        return false;
    if (m_printStartDocument) {
        writer.writeDTD(QStringLiteral("<!DOCTYPE html>"));
        writer.writeStartElement(QStringLiteral("html"));
        writer.writeStartElement(QStringLiteral("head"));
        writer.writeEmptyElement(QStringLiteral("meta"));
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
        writer.writeAttribute(QStringLiteral("charset"), QString::fromLatin1(writer.codec()->name()));
#else
        writer.writeAttribute(QStringLiteral("charset"), QStringLiteral("UTF-8"));
#endif
        writer.writeStartElement(QStringLiteral("title"));
        const QString modelName = m_constModel->objectName();
        writer.writeCharacters(modelName.isEmpty() ? QStringLiteral("Model") : modelName);
        writer.writeEndElement(); // title
        writer.writeStartElement(QStringLiteral("style"));
        writer.writeCharacters(QStringLiteral("table, th, td { border: 1px solid black; } table { border-collapse: collapse; width: 100%; }"));
        writer.writeEndElement(); // style
        writer.writeEndElement(); // head
        writer.writeStartElement(QStringLiteral("body"));
    }
    writer.writeStartElement(QStringLiteral("div"));
    writer.writeAttribute(QStringLiteral("data-modelcode"), Magic_Model_Header);
    writeHtmlElement(writer);
    writer.writeEndElement(); // div
    if (m_printStartDocument) {
        writer.writeEndElement(); // body
        writer.writeEndElement(); // html
    }
    return !writer.hasError();
}